

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

string * __thiscall
MetaCommand::TypeToString_abi_cxx11_
          (string *__return_storage_ptr__,MetaCommand *this,TypeEnumType type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(type) {
  case INT:
    pcVar2 = "int";
    paVar1 = &local_9;
    break;
  case FLOAT:
    pcVar2 = "float";
    paVar1 = &local_a;
    break;
  default:
    pcVar2 = "not defined";
    paVar1 = &local_f;
    break;
  case STRING:
    pcVar2 = "string";
    paVar1 = &local_b;
    break;
  case LIST:
    pcVar2 = "list";
    paVar1 = &local_c;
    break;
  case FLAG:
    pcVar2 = "flag";
    paVar1 = &local_d;
    break;
  case BOOL:
    pcVar2 = "boolean";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

METAIO_STL::string MetaCommand::TypeToString(TypeEnumType type)
{
  switch(type)
    {
    case INT:
      return "int";
    case FLOAT:
      return "float";
    case STRING:
      return "string";
    case LIST:
      return "list";
    case FLAG:
      return "flag";
    case BOOL:
      return "boolean";
    default:
      return "not defined";
    }
}